

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cc
# Opt level: O2

string * __thiscall board::Move::getString_abi_cxx11_(string *__return_storage_ptr__,Move *this)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  undefined3 in_EAX;
  ulong uStack_18;
  char c [5];
  
  uVar1 = this->value;
  iVar2 = *(int *)((long)Board::SQ64 + (ulong)(uVar1 >> 5 & 0x1fc));
  cVar3 = (char)(Board::SQ64[uVar1 & 0x7f] / 8);
  cVar4 = (char)(iVar2 / 8);
  uStack_18 = (ulong)CONCAT16(cVar4 + '1',
                              CONCAT15((char)iVar2 + cVar4 * -8 + 'a',
                                       CONCAT14(cVar3 + '1',
                                                CONCAT13((char)Board::SQ64[uVar1 & 0x7f] +
                                                         cVar3 * -8 + 'a',in_EAX))));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,c,
             (allocator<char> *)((long)register0x00000020 + -0x16));
  if ((uVar1 >> 0x14 & 0xf) != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string board::Move::getString() const
{
    int fromSquare = Board::SQ64[FROMSQ(value)];
    int toSquare = Board::SQ64[TOSQ(value)];
    int promoted = PROMOTED(value);
    char c[] = {static_cast<char>((fromSquare % 8) + 'a'), static_cast<char>((fromSquare / 8) + '1'),
                static_cast<char>((toSquare % 8) + 'a'), static_cast<char>((toSquare / 8) + '1'), '\0'};
    std::string str(static_cast<char*>(c));
    if (promoted) {
        char promotedChar = Board::PIECE_CHARS[promoted];
        str += promotedChar;
    }
    return str;
}